

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_quantization.cc
# Opt level: O2

bool __thiscall
sptk::VectorQuantization::Run
          (VectorQuantization *this,vector<double,_std::allocator<double>_> *input_vector,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *codebook_vectors,int *codebook_index)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double distance;
  
  uVar2 = ((long)(codebook_vectors->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(codebook_vectors->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (this->is_valid_ == true) {
    bVar1 = false;
    if (((codebook_index != (int *)0x0) && (iVar5 = (int)uVar2, bVar1 = false, iVar5 != 0)) &&
       (bVar1 = false,
       (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(input_vector->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == (long)this->num_order_ + 1)) {
      uVar3 = 0;
      uVar2 = uVar2 & 0xffffffff;
      if (iVar5 < 1) {
        uVar2 = uVar3;
      }
      dVar7 = 1.79769313486232e+308;
      uVar4 = 0;
      for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
        bVar1 = DistanceCalculation::Run
                          (&this->distance_calculation_,input_vector,
                           (vector<double,_std::allocator<double>_> *)
                           ((long)&(((codebook_vectors->
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + uVar3),&distance);
        if (!bVar1) goto LAB_0010fdd4;
        if (distance < dVar7) {
          uVar4 = uVar6 & 0xffffffff;
          dVar7 = distance;
        }
        uVar3 = uVar3 + 0x18;
      }
      *codebook_index = (int)uVar4;
      bVar1 = true;
    }
  }
  else {
LAB_0010fdd4:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VectorQuantization::Run(
    const std::vector<double>& input_vector,
    const std::vector<std::vector<double> >& codebook_vectors,
    int* codebook_index) const {
  // Check inputs.
  const int codebook_size(static_cast<int>(codebook_vectors.size()));
  if (!is_valid_ ||
      input_vector.size() != static_cast<std::size_t>(num_order_ + 1) ||
      0 == codebook_size || NULL == codebook_index) {
    return false;
  }

  int index(0);
  double min_distance(sptk::kMax);

  for (int i(0); i < codebook_size; ++i) {
    double distance;
    if (!distance_calculation_.Run(input_vector, codebook_vectors[i],
                                   &distance)) {
      return false;
    }
    if (distance < min_distance) {
      index = i;
      min_distance = distance;
    }
  }

  *codebook_index = index;

  return true;
}